

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReaderManager.cpp
# Opt level: O2

AbstractReader * __thiscall
BufferedReaderManager::getReader(BufferedReaderManager *this,char *streamName)

{
  uint32_t uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = 0xffffffff;
  uVar4 = 0;
  for (uVar3 = 0; uVar3 < this->m_readersCnt; uVar3 = uVar3 + 1) {
    uVar1 = BufferedReader::getReaderCount
                      ((this->m_fileReaders).
                       super__Vector_base<BufferedReader_*,_std::allocator<BufferedReader_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar3]);
    if (uVar1 < uVar2) {
      uVar2 = BufferedReader::getReaderCount
                        ((this->m_fileReaders).
                         super__Vector_base<BufferedReader_*,_std::allocator<BufferedReader_*>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar3]);
      uVar4 = uVar3 & 0xffffffff;
    }
  }
  return &(this->m_fileReaders).
          super__Vector_base<BufferedReader_*,_std::allocator<BufferedReader_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4]->super_AbstractReader;
}

Assistant:

AbstractReader* BufferedReaderManager::getReader(const char* streamName) const
{
    uint32_t minReaderCnt = UINT_MAX;
    uint32_t minReaderIndex = 0;

    for (uint32_t i = 0; i < m_readersCnt; i++)
    {
        if (m_fileReaders[i]->getReaderCount() < minReaderCnt)
        {
            minReaderCnt = m_fileReaders[i]->getReaderCount();
            minReaderIndex = i;
        }
    }
    return m_fileReaders[minReaderIndex];
}